

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall despot::EvalLog::SetInitialBudget(EvalLog *this,string *instance)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  double dVar5;
  string local_90;
  string local_70;
  string local_50;
  
  curr_inst_budget = 0.0;
  iVar2 = GetNumRemainingRuns(this);
  if (iVar2 != 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)instance);
    iVar2 = GetNumRemainingRuns(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Num of remaining runs: curr / total = ");
      std::__cxx11::string::string((string *)&local_70,(string *)instance);
      iVar2 = GetNumRemainingRuns(this,&local_70);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," / ");
      iVar2 = GetNumRemainingRuns(this);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_70);
      dVar5 = curr_inst_start_time;
      lVar1 = start_time;
      iVar2 = GetNumRemainingRuns(this);
      std::__cxx11::string::string((string *)&local_90,(string *)instance);
      iVar3 = GetNumRemainingRuns(this,&local_90);
      curr_inst_budget = (double)iVar3 * ((((double)lVar1 - dVar5) + 86400.0) / (double)iVar2);
      std::__cxx11::string::~string((string *)&local_90);
      dVar5 = 0.0;
      if ((curr_inst_budget < 0.0) || (dVar5 = 1080.0, 1080.0 < curr_inst_budget)) {
        curr_inst_budget = dVar5;
      }
    }
  }
  return;
}

Assistant:

void EvalLog::SetInitialBudget(string instance) {
	curr_inst_budget = 0;
	if (GetNumRemainingRuns() != 0 && GetNumRemainingRuns(instance) != 0) {
		cout << "Num of remaining runs: curr / total = "
				<< GetNumRemainingRuns(instance) << " / "
				<< GetNumRemainingRuns() << endl;
		curr_inst_budget = (24 * 3600 - (curr_inst_start_time - start_time))
				/ GetNumRemainingRuns() * GetNumRemainingRuns(instance);
		if (curr_inst_budget < 0)
			curr_inst_budget = 0;
		if (curr_inst_budget > 18 * 60)
			curr_inst_budget = 18 * 60;
	}
}